

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O2

bool HDRLoader::load(char *fileName,HDRLoaderResult *res)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FILE *__stream;
  float *pfVar8;
  uchar *puVar9;
  char cVar10;
  ulong uVar11;
  uchar *scanline;
  float *pfVar12;
  byte bVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  byte *pbVar17;
  bool bVar18;
  float fVar19;
  int w;
  uchar *local_1f0;
  undefined4 local_1e8;
  int h;
  RGBE *local_1e0;
  float *local_1d8;
  byte *local_1d0;
  char reso [200];
  char str [200];
  
  __stream = fopen(fileName,"rb");
  if (__stream != (FILE *)0x0) {
    fread(str,10,1,__stream);
    iVar2 = bcmp(str,"#?RADIANCE",10);
    if (iVar2 == 0) {
      fseek(__stream,1,1);
      iVar2 = 0;
      do {
        iVar3 = fgetc(__stream);
        cVar10 = (char)iVar2;
        iVar2 = iVar3;
      } while (cVar10 != '\n' || (char)iVar3 != '\n');
      pcVar14 = reso;
      do {
        iVar2 = fgetc(__stream);
        *pcVar14 = (char)iVar2;
        pcVar14 = pcVar14 + 1;
      } while ((char)iVar2 != '\n');
      iVar2 = __isoc99_sscanf(reso,"-Y %d +X %d",&h,&w);
      uVar1 = CONCAT31((int3)((uint)iVar3 >> 8),iVar2 != 0);
      if (iVar2 != 0) {
        lVar15 = (long)w;
        res->width = w;
        res->height = h;
        uVar11 = (long)(h * w * 3) << 2;
        if (h * w < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        local_1e8 = uVar1;
        pfVar8 = (float *)operator_new__(uVar11);
        res->cols = pfVar8;
        uVar11 = lVar15 * 4;
        if (lVar15 < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        puVar9 = (uchar *)operator_new__(uVar11);
        local_1d0 = puVar9 + 3;
        local_1e0 = (RGBE *)(puVar9 + 4);
        iVar2 = h;
        local_1f0 = puVar9;
        while (iVar3 = (int)lVar15, 0 < iVar2) {
          scanline = puVar9;
          if (iVar3 - 0x8000U < 0xffff8008) {
LAB_001dd3a6:
            bVar18 = oldDecrunch((RGBE *)scanline,iVar3,(FILE *)__stream);
            if (!bVar18) break;
          }
          else {
            iVar4 = fgetc(__stream);
            if (iVar4 != 2) {
              fseek(__stream,-1,1);
              goto LAB_001dd3a6;
            }
            iVar4 = fgetc(__stream);
            puVar9[1] = (uchar)iVar4;
            iVar5 = fgetc(__stream);
            puVar9[2] = (uchar)iVar5;
            iVar6 = fgetc(__stream);
            if ((char)(uchar)iVar5 < '\0' || (uchar)iVar4 != '\x02') {
              iVar3 = iVar3 + -1;
              *local_1f0 = '\x02';
              local_1f0[3] = (char)iVar6;
              puVar9 = local_1f0;
              scanline = *local_1e0;
              goto LAB_001dd3a6;
            }
            puVar9 = local_1f0;
            local_1d8 = pfVar8;
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              lVar16 = 0;
              while (iVar4 = (int)lVar16, iVar4 < iVar3) {
                uVar7 = fgetc(__stream);
                if ((uVar7 & 0xff) < 0x81) {
                  lVar16 = (long)iVar4;
                  while (cVar10 = (char)uVar7, uVar7 = (uint)(byte)(cVar10 - 1), cVar10 != '\0') {
                    iVar4 = fgetc(__stream);
                    puVar9[lVar16 * 4] = (char)iVar4;
                    lVar16 = lVar16 + 1;
                  }
                }
                else {
                  bVar13 = (byte)uVar7 & 0x7f;
                  iVar5 = fgetc(__stream);
                  lVar16 = (long)iVar4;
                  while (bVar18 = bVar13 != 0, bVar13 = bVar13 - 1, bVar18) {
                    puVar9[lVar16 * 4] = (char)iVar5;
                    lVar16 = lVar16 + 1;
                  }
                }
              }
              puVar9 = puVar9 + 1;
            }
            iVar3 = feof(__stream);
            puVar9 = local_1f0;
            pfVar8 = local_1d8;
            if (iVar3 != 0) break;
          }
          iVar2 = iVar2 + -1;
          pfVar12 = pfVar8;
          pbVar17 = local_1d0;
          for (iVar3 = w; 0 < iVar3; iVar3 = iVar3 + -1) {
            iVar4 = *pbVar17 - 0x80;
            fVar19 = convertComponent(iVar4,(uint)pbVar17[-3]);
            bVar13 = pbVar17[-2];
            *pfVar12 = fVar19;
            fVar19 = convertComponent(iVar4,(uint)bVar13);
            puVar9 = local_1f0;
            bVar13 = pbVar17[-1];
            pfVar12[1] = fVar19;
            fVar19 = convertComponent(iVar4,(uint)bVar13);
            pfVar12[2] = fVar19;
            pfVar12 = pfVar12 + 3;
            pbVar17 = pbVar17 + 4;
          }
          lVar15 = (long)w;
          pfVar8 = pfVar8 + lVar15 * 3;
        }
        operator_delete__(puVar9);
        uVar1 = local_1e8;
      }
      fclose(__stream);
      return (bool)(char)uVar1;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

bool HDRLoader::load(const char *fileName, HDRLoaderResult &res)
{
	int i;
	char str[200];
	FILE *file;

	file = fopen(fileName, "rb");
	if (!file)
		return false;

	fread(str, 10, 1, file);
	if (memcmp(str, "#?RADIANCE", 10)) {
		fclose(file);
		return false;
	}

	fseek(file, 1, SEEK_CUR);

	char cmd[200];
	i = 0;
	char c = 0, oldc;
	while(true) {
		oldc = c;
		c = fgetc(file);
		if (c == 0xa && oldc == 0xa)
			break;
		cmd[i++] = c;
	}

	char reso[200];
	i = 0;
	while(true) {
		c = fgetc(file);
		reso[i++] = c;
		if (c == 0xa)
			break;
	}

	int w, h;
	if (!sscanf(reso, "-Y %d +X %d", &h, &w)) {
		fclose(file);
		return false;
	}

	res.width = w;
	res.height = h;

	float *cols = new float[w * h * 3];
	res.cols = cols;

	RGBE *scanline = new RGBE[w];
	if (!scanline) {
		fclose(file);
		return false;
	}

	// convert image 
	for (int y = h - 1; y >= 0; y--) {
		if (decrunch(scanline, w, file) == false)
			break;
		workOnRGBE(scanline, w, cols);
		cols += w * 3;
	}

	delete [] scanline;
	fclose(file);

	return true;
}